

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_uint.h
# Opt level: O2

int __thiscall jbcoin::base_uint<160UL,_void>::signum(base_uint<160UL,_void> *this)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 5) break;
    uVar1 = uVar2 + 1;
  } while (this->pn[uVar2] == 0);
  return (int)(uVar2 < 5);
}

Assistant:

int signum() const
    {
        for (int i = 0; i < WIDTH; i++)
            if (pn[i] != 0)
                return 1;

        return 0;
    }